

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# foreign_key_constraint.cpp
# Opt level: O2

string * __thiscall
duckdb::ForeignKeyConstraint::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ForeignKeyConstraint *this)

{
  const_reference pvVar1;
  idx_t i_1;
  idx_t i;
  ulong uVar2;
  string local_50;
  
  if ((this->info).type == FK_TYPE_FOREIGN_KEY_TABLE) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"FOREIGN KEY (",(allocator *)&local_50);
    for (uVar2 = 0;
        uVar2 < (ulong)((long)(this->fk_columns).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->fk_columns).
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
      if (uVar2 != 0) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&this->fk_columns,uVar2);
      KeywordHelper::WriteOptionallyQuoted(&local_50,pvVar1,'\"',true);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_50);
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((this->info).schema._M_string_length != 0) {
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    ::std::__cxx11::string::append((string *)__return_storage_ptr__);
    if ((this->pk_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->pk_columns).
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      for (uVar2 = 0;
          uVar2 < (ulong)((long)(this->pk_columns).
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->pk_columns).
                                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1)
      {
        if (uVar2 != 0) {
          ::std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::get<true>(&this->pk_columns,uVar2);
        KeywordHelper::WriteOptionallyQuoted(&local_50,pvVar1,'\"',true);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_50);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  else {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,anon_var_dwarf_3b2a81b + 9,(allocator *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

string ForeignKeyConstraint::ToString() const {
	if (info.type == ForeignKeyType::FK_TYPE_FOREIGN_KEY_TABLE) {
		string base = "FOREIGN KEY (";

		for (idx_t i = 0; i < fk_columns.size(); i++) {
			if (i > 0) {
				base += ", ";
			}
			base += KeywordHelper::WriteOptionallyQuoted(fk_columns[i]);
		}
		base += ") REFERENCES ";
		if (!info.schema.empty()) {
			base += info.schema;
			base += ".";
		}
		base += info.table;
		if (!pk_columns.empty()) {
			base += "(";

			for (idx_t i = 0; i < pk_columns.size(); i++) {
				if (i > 0) {
					base += ", ";
				}
				base += KeywordHelper::WriteOptionallyQuoted(pk_columns[i]);
			}
			base += ")";
		}

		return base;
	}

	return "";
}